

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

bool __thiscall
helics::HandleManager::addAliasName(HandleManager *this,string_view interfaceName,string_view alias)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view alias_00;
  string_view alias_01;
  string_view alias_02;
  string_view interfaceName_00;
  string_view interfaceName_01;
  string_view interfaceName_02;
  bool bVar1;
  reference pbVar2;
  char *in_RCX;
  HandleManager *in_RDX;
  char *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  value_type *in_R8;
  basic_string_view<char,_std::char_traits<char>_> *otherAlias;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  aliasIterator;
  mapped_type *aliasVector;
  iterator fnd;
  bool cascading;
  key_type *in_stack_fffffffffffffea8;
  mapped_type *this_00;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  byte bVar3;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_f0;
  mapped_type *local_e8;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  value_type *in_stack_ffffffffffffff38;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_98;
  mapped_type *local_90;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
  local_68;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
  local_60;
  byte local_51;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  bool local_1;
  
  __x._M_str = in_stack_fffffffffffffee0;
  __x._M_len = (size_t)in_stack_fffffffffffffed8._M_current;
  __y._M_str = (char *)in_stack_fffffffffffffed0._M_current;
  __y._M_len = (size_t)in_stack_fffffffffffffec8;
  pbVar4 = in_RDI;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    local_1 = false;
  }
  else {
    local_51 = 0;
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
         ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                 *)in_stack_fffffffffffffea8,(key_type *)0x635c45);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
         ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                *)in_stack_fffffffffffffea8);
    bVar1 = CLI::std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                        *)&local_60,
                       (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                        *)&local_68);
    if (bVar1) {
      std::
      unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
      ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                (in_stack_fffffffffffffec0,in_RDI);
      interfaceName_00._M_str = in_RSI;
      interfaceName_00._M_len = (size_t)in_R8;
      alias_00._M_str = in_RCX;
      alias_00._M_len = (size_t)pbVar4;
      local_51 = addAliasName(in_RDX,interfaceName_00,alias_00);
    }
    else {
      local_90 = std::
                 unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                 ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                              in_stack_fffffffffffffea8);
      CLI::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)in_stack_fffffffffffffea8);
      CLI::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)in_stack_fffffffffffffea8);
      local_98 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,std::basic_string_view<char,std::char_traits<char>>>
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffec8);
      CLI::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)in_stack_fffffffffffffea8);
      bVar1 = __gnu_cxx::
              operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                         (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          *)in_stack_fffffffffffffea8);
      bVar3 = 1;
      if (!bVar1) {
        in_stack_ffffffffffffff38 = in_R8;
        pbVar2 = __gnu_cxx::
                 __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::operator*(&local_98);
        in_stack_ffffffffffffff40 =
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)pbVar2->_M_len;
        in_stack_ffffffffffffff48._M_current =
             (basic_string_view<char,_std::char_traits<char>_> *)pbVar2->_M_str;
        __x_00._M_str = in_stack_fffffffffffffee0;
        __x_00._M_len = (size_t)in_stack_fffffffffffffed8._M_current;
        __y_00._M_str = (char *)in_stack_fffffffffffffed0._M_current;
        __y_00._M_len = (size_t)in_stack_fffffffffffffec8;
        in_R8 = in_stack_ffffffffffffff38;
        bVar1 = std::operator==(__x_00,__y_00);
        bVar3 = bVar1 ^ 0xff;
      }
      if ((bVar3 & 1) != 0) {
        this_00 = local_90;
        __gnu_cxx::
        __normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
        ::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*>
                  ((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)CONCAT17(bVar3,in_stack_fffffffffffffeb0),
                   (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)local_90);
        local_e0 = (basic_string_view<char,_std::char_traits<char>_> *)
                   std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::insert(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff38);
        local_51 = 1;
        local_e8 = local_90;
        local_f0._M_current =
             (basic_string_view<char,_std::char_traits<char>_> *)
             CLI::std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00);
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)this_00);
        while (bVar1 = __gnu_cxx::
                       operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                 ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                   *)CONCAT17(bVar3,in_stack_fffffffffffffeb0),
                                  (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                   *)this_00), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::operator*(&local_f0);
          interfaceName_01._M_str = in_RSI;
          interfaceName_01._M_len = (size_t)in_R8;
          alias_01._M_str = in_RCX;
          alias_01._M_len = (size_t)pbVar4;
          addAliasName(in_RDX,interfaceName_01,alias_01);
          __gnu_cxx::
          __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::operator++(&local_f0);
        }
        interfaceName_02._M_str = in_RSI;
        interfaceName_02._M_len = (size_t)in_R8;
        alias_02._M_str = in_RCX;
        alias_02._M_len = (size_t)pbVar4;
        addAliasName(in_RDX,interfaceName_02,alias_02);
      }
    }
    local_1 = (bool)(local_51 & 1);
  }
  return local_1;
}

Assistant:

bool HandleManager::addAliasName(std::string_view interfaceName, std::string_view alias)
{
    if (interfaceName == alias) {
        return false;
    }
    bool cascading{false};
    auto fnd = aliases.find(interfaceName);
    if (fnd == aliases.end()) {
        aliases[interfaceName].emplace_back(alias);
        cascading = addAliasName(alias, interfaceName);
    } else {
        auto& aliasVector = aliases[interfaceName];
        auto aliasIterator = std::lower_bound(aliasVector.begin(), aliasVector.end(), alias);
        if (aliasIterator == aliasVector.end() || *aliasIterator != alias) {
            aliasVector.insert(aliasIterator, alias);
            cascading = true;
            for (auto& otherAlias : aliasVector) {
                addAliasName(otherAlias, alias);
            }
            addAliasName(alias, interfaceName);
        }
    }

    return cascading;
}